

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests-records_agency.c
# Opt level: O0

greatest_test_res agency_read(void)

{
  int iVar1;
  greatest_type_info *type_info_7;
  greatest_type_info *type_info_6;
  greatest_type_info *type_info_5;
  greatest_type_info *type_info_4;
  greatest_type_info *type_info_3;
  greatest_type_info *type_info_2;
  greatest_type_info *type_info_1;
  greatest_type_info *type_info;
  agency_t a_1;
  char *field_values [8];
  char *field_names [8];
  greatest_test_res local_c;
  
  memcpy(field_values + 7,&DAT_0028ebd0,0x40);
  memcpy(a_1.email + 0x38,&DAT_0028ec10,0x40);
  read_agency((agency_t *)&type_info,8,field_values + 7,(char **)(a_1.email + 0x38));
  greatest_info.assertions = greatest_info.assertions + 1;
  iVar1 = greatest_do_assert_equal_t("1",&type_info,&greatest_type_info_string,(void *)0x0);
  if (iVar1 == 0) {
    if (greatest_type_info_string.equal == (greatest_equal_cb *)0x0) {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests_records/tests-records_agency.c"
      ;
      greatest_info.fail_line = 0x16;
      greatest_info.msg = "type_info->equal callback missing!";
      if ((greatest_info.flags & 4) != 0) {
        abort();
      }
      local_c = GREATEST_TEST_RES_FAIL;
    }
    else {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests_records/tests-records_agency.c"
      ;
      greatest_info.fail_line = 0x16;
      greatest_info.msg = "\"1\" != a_1.id";
      if ((greatest_info.flags & 4) != 0) {
        abort();
      }
      local_c = GREATEST_TEST_RES_FAIL;
    }
  }
  else {
    greatest_info.assertions = greatest_info.assertions + 1;
    iVar1 = greatest_do_assert_equal_t
                      ("blahblah",a_1.id + 0x38,&greatest_type_info_string,(void *)0x0);
    if (iVar1 == 0) {
      if (greatest_type_info_string.equal == (greatest_equal_cb *)0x0) {
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests_records/tests-records_agency.c"
        ;
        greatest_info.fail_line = 0x17;
        greatest_info.msg = "type_info->equal callback missing!";
        if ((greatest_info.flags & 4) != 0) {
          abort();
        }
        local_c = GREATEST_TEST_RES_FAIL;
      }
      else {
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests_records/tests-records_agency.c"
        ;
        greatest_info.fail_line = 0x17;
        greatest_info.msg = "\"blahblah\" != a_1.name";
        if ((greatest_info.flags & 4) != 0) {
          abort();
        }
        local_c = GREATEST_TEST_RES_FAIL;
      }
    }
    else {
      greatest_info.assertions = greatest_info.assertions + 1;
      iVar1 = greatest_do_assert_equal_t
                        ("http://example.com/",a_1.name + 0x38,&greatest_type_info_string,
                         (void *)0x0);
      if (iVar1 == 0) {
        if (greatest_type_info_string.equal == (greatest_equal_cb *)0x0) {
          greatest_info.fail_file =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests_records/tests-records_agency.c"
          ;
          greatest_info.fail_line = 0x18;
          greatest_info.msg = "type_info->equal callback missing!";
          if ((greatest_info.flags & 4) != 0) {
            abort();
          }
          local_c = GREATEST_TEST_RES_FAIL;
        }
        else {
          greatest_info.fail_file =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests_records/tests-records_agency.c"
          ;
          greatest_info.fail_line = 0x18;
          greatest_info.msg = "\"http://example.com/\" != a_1.url";
          if ((greatest_info.flags & 4) != 0) {
            abort();
          }
          local_c = GREATEST_TEST_RES_FAIL;
        }
      }
      else {
        greatest_info.assertions = greatest_info.assertions + 1;
        iVar1 = greatest_do_assert_equal_t
                          ("Europe/Moscow",a_1.url + 0x78,&greatest_type_info_string,(void *)0x0);
        if (iVar1 == 0) {
          if (greatest_type_info_string.equal == (greatest_equal_cb *)0x0) {
            greatest_info.fail_file =
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests_records/tests-records_agency.c"
            ;
            greatest_info.fail_line = 0x19;
            greatest_info.msg = "type_info->equal callback missing!";
            if ((greatest_info.flags & 4) != 0) {
              abort();
            }
            local_c = GREATEST_TEST_RES_FAIL;
          }
          else {
            greatest_info.fail_file =
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests_records/tests-records_agency.c"
            ;
            greatest_info.fail_line = 0x19;
            greatest_info.msg = "\"Europe/Moscow\" != a_1.timezone";
            if ((greatest_info.flags & 4) != 0) {
              abort();
            }
            local_c = GREATEST_TEST_RES_FAIL;
          }
        }
        else {
          greatest_info.assertions = greatest_info.assertions + 1;
          iVar1 = greatest_do_assert_equal_t
                            ("en",a_1.timezone + 0x38,&greatest_type_info_string,(void *)0x0);
          if (iVar1 == 0) {
            if (greatest_type_info_string.equal == (greatest_equal_cb *)0x0) {
              greatest_info.fail_file =
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests_records/tests-records_agency.c"
              ;
              greatest_info.fail_line = 0x1a;
              greatest_info.msg = "type_info->equal callback missing!";
              if ((greatest_info.flags & 4) != 0) {
                abort();
              }
              local_c = GREATEST_TEST_RES_FAIL;
            }
            else {
              greatest_info.fail_file =
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests_records/tests-records_agency.c"
              ;
              greatest_info.fail_line = 0x1a;
              greatest_info.msg = "\"en\" != a_1.lang";
              if ((greatest_info.flags & 4) != 0) {
                abort();
              }
              local_c = GREATEST_TEST_RES_FAIL;
            }
          }
          else {
            greatest_info.assertions = greatest_info.assertions + 1;
            iVar1 = greatest_do_assert_equal_t
                              ("0 000 000 00 00",a_1.lang + 0x38,&greatest_type_info_string,
                               (void *)0x0);
            if (iVar1 == 0) {
              if (greatest_type_info_string.equal == (greatest_equal_cb *)0x0) {
                greatest_info.fail_file =
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests_records/tests-records_agency.c"
                ;
                greatest_info.fail_line = 0x1b;
                greatest_info.msg = "type_info->equal callback missing!";
                if ((greatest_info.flags & 4) != 0) {
                  abort();
                }
                local_c = GREATEST_TEST_RES_FAIL;
              }
              else {
                greatest_info.fail_file =
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests_records/tests-records_agency.c"
                ;
                greatest_info.fail_line = 0x1b;
                greatest_info.msg = "\"0 000 000 00 00\" != a_1.phone";
                if ((greatest_info.flags & 4) != 0) {
                  abort();
                }
                local_c = GREATEST_TEST_RES_FAIL;
              }
            }
            else {
              greatest_info.assertions = greatest_info.assertions + 1;
              iVar1 = greatest_do_assert_equal_t
                                ("http://cash.me/outside",a_1.phone + 0x38,
                                 &greatest_type_info_string,(void *)0x0);
              if (iVar1 == 0) {
                if (greatest_type_info_string.equal == (greatest_equal_cb *)0x0) {
                  greatest_info.fail_file =
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests_records/tests-records_agency.c"
                  ;
                  greatest_info.fail_line = 0x1c;
                  greatest_info.msg = "type_info->equal callback missing!";
                  if ((greatest_info.flags & 4) != 0) {
                    abort();
                  }
                  local_c = GREATEST_TEST_RES_FAIL;
                }
                else {
                  greatest_info.fail_file =
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests_records/tests-records_agency.c"
                  ;
                  greatest_info.fail_line = 0x1c;
                  greatest_info.msg = "\"http://cash.me/outside\" != a_1.fare_url";
                  if ((greatest_info.flags & 4) != 0) {
                    abort();
                  }
                  local_c = GREATEST_TEST_RES_FAIL;
                }
              }
              else {
                greatest_info.assertions = greatest_info.assertions + 1;
                iVar1 = greatest_do_assert_equal_t
                                  ("ex@amp.le",a_1.fare_url + 0x78,&greatest_type_info_string,
                                   (void *)0x0);
                if (iVar1 == 0) {
                  if (greatest_type_info_string.equal == (greatest_equal_cb *)0x0) {
                    greatest_info.fail_file =
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests_records/tests-records_agency.c"
                    ;
                    greatest_info.fail_line = 0x1d;
                    greatest_info.msg = "type_info->equal callback missing!";
                    if ((greatest_info.flags & 4) != 0) {
                      abort();
                    }
                    local_c = GREATEST_TEST_RES_FAIL;
                  }
                  else {
                    greatest_info.fail_file =
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests_records/tests-records_agency.c"
                    ;
                    greatest_info.fail_line = 0x1d;
                    greatest_info.msg = "\"ex@amp.le\" != a_1.email";
                    if ((greatest_info.flags & 4) != 0) {
                      abort();
                    }
                    local_c = GREATEST_TEST_RES_FAIL;
                  }
                }
                else {
                  greatest_info.msg = (char *)0x0;
                  local_c = GREATEST_TEST_RES_PASS;
                }
              }
            }
          }
        }
      }
    }
  }
  return local_c;
}

Assistant:

TEST agency_read(void) {

    #define FIELDS_NUM_1 8
    char *field_names[FIELDS_NUM_1] = {
        "agency_id", "agency_name", "agency_url", "agency_timezone",
        "agency_lang", "agency_phone", "agency_fare_url", "agency_email"
    };
    char *field_values[FIELDS_NUM_1] = {
        "1", "blahblah", "http://example.com/", "Europe/Moscow",
        "en", "0 000 000 00 00", "http://cash.me/outside", "ex@amp.le"
    };

    agency_t a_1;
    read_agency(&a_1, FIELDS_NUM_1, (const char **)field_names, (const char **)field_values);

    ASSERT_STR_EQ("1", a_1.id);
    ASSERT_STR_EQ("blahblah", a_1.name);
    ASSERT_STR_EQ("http://example.com/", a_1.url);
    ASSERT_STR_EQ("Europe/Moscow", a_1.timezone);
    ASSERT_STR_EQ("en", a_1.lang);
    ASSERT_STR_EQ("0 000 000 00 00", a_1.phone);
    ASSERT_STR_EQ("http://cash.me/outside", a_1.fare_url);
    ASSERT_STR_EQ("ex@amp.le", a_1.email);

    PASS();
}